

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathErr(xmlXPathParserContextPtr ctxt,int code)

{
  xmlXPathContextPtr pxVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  xmlErrorPtr err;
  xmlNodePtr pxStack_48;
  int res;
  xmlNodePtr node;
  void *data;
  xmlGenericErrorFunc channel;
  xmlStructuredErrorFunc schannel;
  int code_local;
  xmlXPathParserContextPtr ctxt_local;
  
  channel = (xmlGenericErrorFunc)0x0;
  data = (void *)0x0;
  node = (xmlNodePtr)0x0;
  pxStack_48 = (xmlNode *)0x0;
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if ((code < 0) || (schannel._4_4_ = code, 0x1b < code)) {
      schannel._4_4_ = 0x1b;
    }
    if (ctxt->error == 0) {
      ctxt->error = schannel._4_4_;
      if (ctxt->context != (xmlXPathContextPtr)0x0) {
        pxVar1 = ctxt->context;
        if ((pxVar1->lastError).code == 2) {
          return;
        }
        xmlResetError(&pxVar1->lastError);
        (pxVar1->lastError).domain = 0xc;
        (pxVar1->lastError).code = schannel._4_4_ + 0x4b0;
        (pxVar1->lastError).level = XML_ERR_ERROR;
        if (ctxt->base != (xmlChar *)0x0) {
          pxVar3 = xmlStrdup(ctxt->base);
          (pxVar1->lastError).str1 = (char *)pxVar3;
          if ((pxVar1->lastError).str1 == (char *)0x0) {
            xmlXPathPErrMemory(ctxt);
            return;
          }
        }
        (pxVar1->lastError).int1 = (int)ctxt->cur - (int)ctxt->base;
        (pxVar1->lastError).node = ctxt->context->debugNode;
        channel = (xmlGenericErrorFunc)ctxt->context->error;
        node = (xmlNodePtr)ctxt->context->userData;
        pxStack_48 = ctxt->context->debugNode;
      }
      if (channel == (xmlGenericErrorFunc)0x0) {
        pp_Var4 = __xmlGenericError();
        data = *pp_Var4;
        ppvVar5 = __xmlGenericErrorContext();
        node = (xmlNodePtr)*ppvVar5;
      }
      iVar2 = xmlRaiseError((xmlStructuredErrorFunc)channel,(xmlGenericErrorFunc)data,node,
                            (void *)0x0,pxStack_48,0xc,schannel._4_4_ + 0x4b0,XML_ERR_ERROR,
                            (char *)0x0,0,(char *)ctxt->base,(char *)0x0,(char *)0x0,
                            (int)ctxt->cur - (int)ctxt->base,0,"%s",
                            xmlXPathErrorMessages[schannel._4_4_]);
      if (iVar2 < 0) {
        xmlXPathPErrMemory(ctxt);
      }
    }
  }
  return;
}

Assistant:

void
xmlXPathErr(xmlXPathParserContextPtr ctxt, int code)
{
    xmlStructuredErrorFunc schannel = NULL;
    xmlGenericErrorFunc channel = NULL;
    void *data = NULL;
    xmlNodePtr node = NULL;
    int res;

    if (ctxt == NULL)
        return;
    if ((code < 0) || (code > MAXERRNO))
	code = MAXERRNO;
    /* Only report the first error */
    if (ctxt->error != 0)
        return;

    ctxt->error = code;

    if (ctxt->context != NULL) {
        xmlErrorPtr err = &ctxt->context->lastError;

        /* Don't overwrite memory error. */
        if (err->code == XML_ERR_NO_MEMORY)
            return;

        /* cleanup current last error */
        xmlResetError(err);

        err->domain = XML_FROM_XPATH;
        err->code = code + XML_XPATH_EXPRESSION_OK - XPATH_EXPRESSION_OK;
        err->level = XML_ERR_ERROR;
        if (ctxt->base != NULL) {
            err->str1 = (char *) xmlStrdup(ctxt->base);
            if (err->str1 == NULL) {
                xmlXPathPErrMemory(ctxt);
                return;
            }
        }
        err->int1 = ctxt->cur - ctxt->base;
        err->node = ctxt->context->debugNode;

        schannel = ctxt->context->error;
        data = ctxt->context->userData;
        node = ctxt->context->debugNode;
    }

    if (schannel == NULL) {
        channel = xmlGenericError;
        data = xmlGenericErrorContext;
    }

    res = xmlRaiseError(schannel, channel, data, NULL, node, XML_FROM_XPATH,
                        code + XML_XPATH_EXPRESSION_OK - XPATH_EXPRESSION_OK,
                        XML_ERR_ERROR, NULL, 0,
                        (const char *) ctxt->base, NULL, NULL,
                        ctxt->cur - ctxt->base, 0,
                        "%s", xmlXPathErrorMessages[code]);
    if (res < 0)
        xmlXPathPErrMemory(ctxt);
}